

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

_Bool extent_purge_forced_impl
                (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent,
                size_t offset,size_t length,_Bool growing_retained)

{
  code *pcVar1;
  byte bVar2;
  uint uVar3;
  tsdn_t *tsdn_00;
  size_t sVar4;
  extent_t *in_RCX;
  long *in_RDX;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  byte in_stack_00000008;
  _Bool err;
  tsd_t *tsd;
  uint8_t state;
  extent_hooks_t **in_stack_ffffffffffffff48;
  long lVar5;
  arena_t *in_stack_ffffffffffffff50;
  arena_t *in_stack_ffffffffffffff60;
  tsdn_t *in_stack_ffffffffffffff68;
  _Bool local_49;
  witness_tsdn_t *local_38;
  
  if (in_RDI == 0) {
    local_38 = (witness_tsdn_t *)0x0;
  }
  else {
    local_38 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_38,0xc,(uint)((in_stack_00000008 & 1) != 0));
  extent_hooks_assure_initialized(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (*(long *)(*in_RDX + 0x30) == 0) {
    local_49 = true;
  }
  else {
    if ((extent_hooks_t *)*in_RDX != &extent_hooks_default) {
      extent_hook_pre_reentrancy(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    pcVar1 = *(code **)(*in_RDX + 0x30);
    lVar5 = *in_RDX;
    tsdn_00 = (tsdn_t *)extent_base_get(in_RCX);
    sVar4 = extent_size_get(in_RCX);
    uVar3 = arena_ind_get((arena_t *)0x168644);
    bVar2 = (*pcVar1)(lVar5,tsdn_00,sVar4,in_R8,in_R9,uVar3);
    local_49 = (_Bool)(bVar2 & 1);
    if ((extent_hooks_t *)*in_RDX != &extent_hooks_default) {
      extent_hook_post_reentrancy(tsdn_00);
    }
  }
  return local_49;
}

Assistant:

static bool
extent_purge_forced_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent, size_t offset,
    size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	if ((*r_extent_hooks)->purge_forced == NULL) {
		return true;
	}
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	bool err = (*r_extent_hooks)->purge_forced(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), offset, length,
	    arena_ind_get(arena));
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	return err;
}